

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcTransportElementType::~IfcTransportElementType
          (IfcTransportElementType *this)

{
  IfcTypeProduct *this_00;
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject
                   + -0x18);
  this_00 = (IfcTypeProduct *)
            (&(this->super_IfcElementType).super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
            lVar2);
  pvVar1 = &this->field_0x1a0 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x1a0) = 0x9b6b48;
  *(undefined8 *)((long)pvVar1 + 0x10) = 0x9b6c38;
  *(undefined8 *)((long)pvVar1 + -0x118) = 0x9b6b70;
  *(undefined8 *)((long)pvVar1 + -0x108) = 0x9b6b98;
  *(undefined8 *)((long)pvVar1 + -0xb0) = 0x9b6bc0;
  *(undefined8 *)((long)pvVar1 + -0x58) = 0x9b6be8;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x9b6c10;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  *(undefined8 *)&this_00->super_IfcTypeObject = 0x9b6d98;
  *(undefined8 *)&this_00[1].super_IfcTypeObject.field_0x50 = 0x9b6e60;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0x88 = 0x9b6dc0;
  (this_00->super_IfcTypeObject).super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>.
  _vptr_ObjectHelper = (_func_int **)0x9b6de8;
  *(undefined8 *)&(this_00->super_IfcTypeObject).field_0xf0 = 0x9b6e10;
  *(undefined8 *)&this_00->field_0x148 = 0x9b6e38;
  if (*(undefined1 **)&this_00->field_0x158 != &this_00[1].super_IfcTypeObject.field_0x8) {
    operator_delete(*(undefined1 **)&this_00->field_0x158);
  }
  IfcTypeProduct::~IfcTypeProduct(this_00,&PTR_construction_vtable_24__009b6c58);
  operator_delete(this_00);
  return;
}

Assistant:

IfcTransportElementType() : Object("IfcTransportElementType") {}